

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS ref_grid_faceid_range(REF_GRID ref_grid,REF_INT *min_faceid,REF_INT *max_faceid)

{
  REF_CELL pRVar1;
  REF_MPI ref_mpi;
  REF_STATUS RVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  REF_INT global;
  REF_MPI local_b0;
  REF_INT nodes [27];
  
  local_b0 = ref_grid->mpi;
  *min_faceid = 0x7fffffff;
  *max_faceid = -0x80000000;
  pRVar1 = ref_grid->cell[3];
  for (iVar6 = 0; iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
    RVar2 = ref_cell_nodes(pRVar1,iVar6,nodes);
    if (RVar2 == 0) {
      iVar4 = nodes[pRVar1->node_per];
      if (*min_faceid < nodes[pRVar1->node_per]) {
        iVar4 = *min_faceid;
      }
      *min_faceid = iVar4;
      iVar4 = nodes[pRVar1->node_per];
      if (nodes[pRVar1->node_per] < *max_faceid) {
        iVar4 = *max_faceid;
      }
      *max_faceid = iVar4;
    }
  }
  pRVar1 = ref_grid->cell[6];
  for (iVar6 = 0; ref_mpi = local_b0, iVar6 < pRVar1->max; iVar6 = iVar6 + 1) {
    RVar2 = ref_cell_nodes(pRVar1,iVar6,nodes);
    if (RVar2 == 0) {
      iVar4 = nodes[pRVar1->node_per];
      if (*min_faceid < nodes[pRVar1->node_per]) {
        iVar4 = *min_faceid;
      }
      *min_faceid = iVar4;
      iVar4 = nodes[pRVar1->node_per];
      if (nodes[pRVar1->node_per] < *max_faceid) {
        iVar4 = *max_faceid;
      }
      *max_faceid = iVar4;
    }
  }
  uVar3 = 0;
  if (1 < local_b0->n) {
    uVar3 = ref_mpi_min(local_b0,min_faceid,&global,1);
    if (uVar3 == 0) {
      uVar3 = ref_mpi_bcast(ref_mpi,&global,1,1);
      if (uVar3 == 0) {
        *min_faceid = global;
        uVar3 = ref_mpi_max(ref_mpi,max_faceid,&global,1);
        if (uVar3 == 0) {
          uVar3 = ref_mpi_bcast(ref_mpi,&global,1,1);
          if (uVar3 == 0) {
            *max_faceid = global;
            return 0;
          }
          pcVar7 = "mpi max face";
          uVar5 = 0x179;
        }
        else {
          pcVar7 = "mpi max face";
          uVar5 = 0x178;
        }
      }
      else {
        pcVar7 = "mpi min face";
        uVar5 = 0x174;
      }
    }
    else {
      pcVar7 = "mpi min face";
      uVar5 = 0x173;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar5,
           "ref_grid_faceid_range",(ulong)uVar3,pcVar7);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_grid_faceid_range(REF_GRID ref_grid, REF_INT *min_faceid,
                                         REF_INT *max_faceid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_faceid = REF_INT_MAX;
  *max_faceid = REF_INT_MIN;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_faceid = MIN(*min_faceid, nodes[ref_cell_node_per(ref_cell)]);
    *max_faceid = MAX(*max_faceid, nodes[ref_cell_node_per(ref_cell)]);
  }